

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

tuple __thiscall
pybind11::make_tuple<(pybind11::return_value_policy)1,std::__cxx11::string&>
          (pybind11 *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_)

{
  array<pybind11::object,_1UL> aVar1;
  cast_error *__return_storage_ptr__;
  array<pybind11::object,_1UL> args;
  string local_38;
  
  args._M_elems[0].super_handle.m_ptr =
       (_Type)detail::
              string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              ::cast(args_,automatic_reference,(handle)0x0);
  if (args._M_elems[0].super_handle.m_ptr != (object)0x0) {
    tuple::tuple<unsigned_long,_0>((tuple *)this,1);
    aVar1._M_elems[0].super_handle.m_ptr = args._M_elems[0].super_handle.m_ptr;
    args._M_elems[0].super_handle.m_ptr = (_Type)(object)0x0;
    (*(_Type *)(*(long *)this + 0x18))[0] = (object)aVar1._M_elems[0].super_handle.m_ptr;
    object::~object(args._M_elems);
    return (object)(object)this;
  }
  __return_storage_ptr__ = (cast_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_38,0);
  cast_error_unable_to_convert_call_arg(__return_storage_ptr__,&local_38);
  __cxa_throw(__return_storage_ptr__,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

tuple make_tuple(Args &&...args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args{{reinterpret_steal<object>(
        detail::make_caster<Args>::cast(std::forward<Args>(args_), policy, nullptr))...}};
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if !defined(PYBIND11_DETAILED_ERROR_MESSAGES)
            throw cast_error_unable_to_convert_call_arg(std::to_string(i));
#else
            std::array<std::string, size> argtypes{{type_id<Args>()...}};
            throw cast_error_unable_to_convert_call_arg(std::to_string(i), argtypes[i]);
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args) {
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    }
    return result;
}